

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O0

void HistogramAddSinglePixOrCopy
               (VP8LHistogram *histo,PixOrCopy *v,_func_int_int_int *distance_modifier,
               int distance_modifier_arg0)

{
  long lVar1;
  int iVar2;
  uint32_t uVar3;
  undefined4 in_ECX;
  code *in_RDX;
  PixOrCopy *in_RSI;
  long *in_RDI;
  int extra_bits;
  int code;
  int literal_ix;
  int *in_stack_ffffffffffffffb0;
  int *in_stack_ffffffffffffffb8;
  long *plVar4;
  undefined8 in_stack_ffffffffffffffc0;
  int distance;
  int local_24;
  
  distance = (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20);
  iVar2 = PixOrCopyIsLiteral(in_RSI);
  if (iVar2 == 0) {
    iVar2 = PixOrCopyIsCacheIdx(in_RSI);
    if (iVar2 == 0) {
      PixOrCopyLength(in_RSI);
      VP8LPrefixEncodeBits(distance,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
      *(int *)(*in_RDI + (long)(local_24 + 0x100) * 4) =
           *(int *)(*in_RDI + (long)(local_24 + 0x100) * 4) + 1;
      if (in_RDX == (code *)0x0) {
        PixOrCopyDistance(in_RSI);
        VP8LPrefixEncodeBits(distance,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
      }
      else {
        uVar3 = PixOrCopyDistance(in_RSI);
        (*in_RDX)(in_ECX,uVar3);
        VP8LPrefixEncodeBits(distance,in_stack_ffffffffffffffb8,(int *)in_RDX);
      }
      *(int *)((long)in_RDI + (long)local_24 * 4 + 0xc08) =
           *(int *)((long)in_RDI + (long)local_24 * 4 + 0xc08) + 1;
    }
    else {
      uVar3 = PixOrCopyCacheIdx(in_RSI);
      *(int *)(*in_RDI + (long)(int)(uVar3 + 0x118) * 4) =
           *(int *)(*in_RDI + (long)(int)(uVar3 + 0x118) * 4) + 1;
    }
  }
  else {
    plVar4 = in_RDI;
    uVar3 = PixOrCopyLiteral(in_RSI,3);
    *(int *)((long)plVar4 + (ulong)uVar3 * 4 + 0x808) =
         *(int *)((long)plVar4 + (ulong)uVar3 * 4 + 0x808) + 1;
    plVar4 = in_RDI;
    uVar3 = PixOrCopyLiteral(in_RSI,2);
    *(int *)((long)plVar4 + (ulong)uVar3 * 4 + 8) =
         *(int *)((long)plVar4 + (ulong)uVar3 * 4 + 8) + 1;
    lVar1 = *in_RDI;
    uVar3 = PixOrCopyLiteral(in_RSI,1);
    *(int *)(lVar1 + (ulong)uVar3 * 4) = *(int *)(lVar1 + (ulong)uVar3 * 4) + 1;
    uVar3 = PixOrCopyLiteral(in_RSI,0);
    *(int *)((long)in_RDI + (ulong)uVar3 * 4 + 0x408) =
         *(int *)((long)in_RDI + (ulong)uVar3 * 4 + 0x408) + 1;
  }
  return;
}

Assistant:

static void HistogramAddSinglePixOrCopy(
    VP8LHistogram* const histo, const PixOrCopy* const v,
    int (*const distance_modifier)(int, int), int distance_modifier_arg0) {
  if (PixOrCopyIsLiteral(v)) {
    ++histo->alpha[PixOrCopyLiteral(v, 3)];
    ++histo->red[PixOrCopyLiteral(v, 2)];
    ++histo->literal[PixOrCopyLiteral(v, 1)];
    ++histo->blue[PixOrCopyLiteral(v, 0)];
  } else if (PixOrCopyIsCacheIdx(v)) {
    const int literal_ix =
        NUM_LITERAL_CODES + NUM_LENGTH_CODES + PixOrCopyCacheIdx(v);
    assert(histo->palette_code_bits != 0);
    ++histo->literal[literal_ix];
  } else {
    int code, extra_bits;
    VP8LPrefixEncodeBits(PixOrCopyLength(v), &code, &extra_bits);
    ++histo->literal[NUM_LITERAL_CODES + code];
    if (distance_modifier == NULL) {
      VP8LPrefixEncodeBits(PixOrCopyDistance(v), &code, &extra_bits);
    } else {
      VP8LPrefixEncodeBits(
          distance_modifier(distance_modifier_arg0, PixOrCopyDistance(v)),
          &code, &extra_bits);
    }
    ++histo->distance[code];
  }
}